

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void DLevelScript::ReplaceTextures(int fromnamei,int tonamei,int flags)

{
  FTextureID FVar1;
  FTextureID FVar2;
  char *name;
  char *name_00;
  FTextureID *pFVar3;
  long lVar4;
  sector_t_conflict *psVar5;
  sector_t_conflict *psVar6;
  FTextureID *pFVar7;
  int j;
  long lVar8;
  
  name = FBehavior::StaticLookupString(fromnamei);
  name_00 = FBehavior::StaticLookupString(tonamei);
  if (name != (char *)0x0) {
    if (flags != 7) {
      FVar1 = FTextureManager::GetTexture(&TexMan,name,1,2);
      FVar2 = FTextureManager::GetTexture(&TexMan,name_00,1,2);
      if (0 < numsides) {
        pFVar3 = &sides->textures[0].texture;
        lVar4 = 0;
        do {
          lVar8 = 0;
          pFVar7 = pFVar3;
          do {
            if ((((uint)"\x04\x02\x01"[lVar8] & flags) == 0) && (pFVar7->texnum == FVar1.texnum)) {
              pFVar7->texnum = FVar2.texnum;
            }
            lVar8 = lVar8 + 1;
            pFVar7 = pFVar7 + 0xc;
          } while (lVar8 != 3);
          lVar4 = lVar4 + 1;
          pFVar3 = pFVar3 + 0x30;
        } while (lVar4 < numsides);
      }
      if (flags == 0x18) {
        return;
      }
    }
    FVar1 = FTextureManager::GetTexture(&TexMan,name,2,2);
    FVar2 = FTextureManager::GetTexture(&TexMan,name_00,2,2);
    if (0 < numsectors) {
      lVar8 = 0;
      lVar4 = 0;
      psVar5 = sectors;
      do {
        psVar6 = psVar5;
        if ((((flags & 8U) == 0) &&
            (*(int *)((long)&psVar5->planes[0].Texture.texnum + lVar8) == FVar1.texnum)) &&
           (*(int *)((long)&psVar5->planes[0].Texture.texnum + lVar8) = FVar2.texnum,
           FVar1.texnum != FVar2.texnum)) {
          sector_t::AdjustFloorClip((sector_t *)((long)&psVar5->planes[0].xform.xOffs + lVar8));
          psVar6 = sectors;
        }
        if (((flags & 0x10U) == 0) &&
           (*(int *)((long)&psVar5->planes[1].Texture.texnum + lVar8) == FVar1.texnum)) {
          *(int *)((long)&psVar5->planes[1].Texture.texnum + lVar8) = FVar2.texnum;
        }
        lVar4 = lVar4 + 1;
        lVar8 = lVar8 + 0x218;
        psVar5 = psVar6;
      } while (lVar4 < numsectors);
    }
  }
  return;
}

Assistant:

void DLevelScript::ReplaceTextures (int fromnamei, int tonamei, int flags)
{
	const char *fromname = FBehavior::StaticLookupString (fromnamei);
	const char *toname = FBehavior::StaticLookupString (tonamei);
	FTextureID picnum1, picnum2;

	if (fromname == NULL)
		return;

	if ((flags ^ (NOT_BOTTOM | NOT_MIDDLE | NOT_TOP)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsides; ++i)
		{
			side_t *wal = &sides[i];

			for(int j=0;j<3;j++)
			{
				static BYTE bits[]={NOT_TOP, NOT_MIDDLE, NOT_BOTTOM};
				if (!(flags & bits[j]) && wal->GetTexture(j) == picnum1)
				{
					wal->SetTexture(j, picnum2);
				}
			}
		}
	}
	if ((flags ^ (NOT_FLOOR | NOT_CEILING)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsectors; ++i)
		{
			sector_t *sec = &sectors[i];

			if (!(flags & NOT_FLOOR) && sec->GetTexture(sector_t::floor) == picnum1) 
				sec->SetTexture(sector_t::floor, picnum2);
			if (!(flags & NOT_CEILING) && sec->GetTexture(sector_t::ceiling) == picnum1)	
				sec->SetTexture(sector_t::ceiling, picnum2);
		}
	}
}